

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void problem_clear(CUPDLPproblem *problem)

{
  if (problem != (CUPDLPproblem *)0x0) {
    if (problem->data != (CUPDLPdata *)0x0) {
      data_clear(problem->data);
    }
    if (problem->lower != (cupdlp_float *)0x0) {
      free(problem->lower);
      problem->lower = (cupdlp_float *)0x0;
    }
    if (problem->upper != (cupdlp_float *)0x0) {
      free(problem->upper);
      problem->upper = (cupdlp_float *)0x0;
    }
    if (problem->cost != (cupdlp_float *)0x0) {
      free(problem->cost);
      problem->cost = (cupdlp_float *)0x0;
    }
    if (problem->rhs != (cupdlp_float *)0x0) {
      free(problem->rhs);
      problem->rhs = (cupdlp_float *)0x0;
    }
    if (problem->hasLower != (cupdlp_float *)0x0) {
      free(problem->hasLower);
      problem->hasLower = (cupdlp_float *)0x0;
    }
    free(problem->hasUpper);
    free(problem);
    return;
  }
  return;
}

Assistant:

void problem_clear(CUPDLPproblem *problem) {
  if (problem) {
    if (problem->data) {
      data_clear(problem->data);
    }
    //        if (problem->colMatBeg) {
    //            cupdlp_free(problem->colMatBeg);
    //        }
    //        if (problem->colMatIdx) {
    //            cupdlp_free(problem->colMatIdx);
    //        }
    //        if (problem->colMatElem) {
    //            cupdlp_free(problem->colMatElem);
    //        }
    //        if (problem->rowMatBeg) {
    //            cupdlp_free(problem->rowMatBeg);
    //        }
    //        if (problem->rowMatIdx) {
    //            cupdlp_free(problem->rowMatIdx);
    //        }
    //        if (problem->rowMatElem) {
    //            cupdlp_free(problem->rowMatElem);
    //        }
    if (problem->lower) {
      CUPDLP_FREE_VEC(problem->lower);
    }
    if (problem->upper) {
      CUPDLP_FREE_VEC(problem->upper);
    }
    if (problem->cost) {
      CUPDLP_FREE_VEC(problem->cost);
    }
    if (problem->rhs) {
      CUPDLP_FREE_VEC(problem->rhs);
    }
    if (problem->hasLower) {
      CUPDLP_FREE_VEC(problem->hasLower);
    }
    if (problem->hasUpper) {
      CUPDLP_FREE_VEC(problem->hasUpper);
    }
    cupdlp_free(problem);
  }
}